

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O0

GainedCell __thiscall GainBuckets::getMaxGainedCell(GainBuckets *this)

{
  Bucket *this_00;
  const_reference __a;
  GainBuckets *this_local;
  
  if (this->best_gain_ != -0x80000000) {
    this_00 = operator[][abi_cxx11_(this,this->best_gain_);
    __a = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::front(this_00);
    std::pair<unsigned_int,_int>::pair<unsigned_int,_int,_true>
              ((pair<unsigned_int,_int> *)&this_local,__a,&this->best_gain_);
    return (GainedCell)this_local;
  }
  __assert_fail("best_gain_ != INT_MIN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]hypergraph-partitioning/FM.cpp"
                ,0x4b,"GainBuckets::GainedCell GainBuckets::getMaxGainedCell() const");
}

Assistant:

GainBuckets::GainedCell GainBuckets::getMaxGainedCell() const {
  assert(best_gain_ != INT_MIN);
  return GainedCell{(*this)[best_gain_].front(), best_gain_};
}